

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadPool.h
# Opt level: O0

void __thiscall ThreadPool<int,_8UL>::addTask(ThreadPool<int,_8UL> *this,int *value)

{
  mutex_type *in_RDI;
  unique_lock<std::mutex> mutexLock;
  unique_lock<std::mutex> *in_stack_ffffffffffffffd0;
  
  std::unique_lock<std::mutex>::unique_lock(in_stack_ffffffffffffffd0,in_RDI);
  std::queue<int,_std::deque<int,_std::allocator<int>_>_>::push
            ((queue<int,_std::deque<int,_std::allocator<int>_>_> *)in_stack_ffffffffffffffd0,
             (value_type *)in_RDI);
  std::condition_variable::notify_one();
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffffd0);
  return;
}

Assistant:

void addTask(const T& value)
    {
        std::unique_lock<std::mutex> mutexLock(queueMutex);
        tasks.push(value);
        condition.notify_one();
    }